

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-session.c
# Opt level: O0

int lws_tls_session_dump_load
              (lws_vhost *vh,char *host,uint16_t port,lws_tls_sess_cb_t cb_load,void *opq)

{
  int iVar1;
  lws_tls_sco_t *plVar2;
  SSL_SESSION *ses;
  void *v;
  SSL_SESSION *sess;
  lws_tls_sco_t *ts;
  lws_tls_session_dump d;
  void *opq_local;
  lws_tls_sess_cb_t cb_load_local;
  uint16_t port_local;
  char *host_local;
  lws_vhost *vh_local;
  
  if ((vh->options & 0x8000000000) == 0) {
    d.blob = opq;
    d.blob_len = (size_t)opq;
    lws_tls_session_tag_discrete(vh->name,host,port,(char *)&ts,0x60);
    plVar2 = __lws_tls_session_lookup_by_name(vh,(char *)&ts);
    if (plVar2 == (lws_tls_sco_t *)0x0) {
      iVar1 = (*cb_load)(vh->context,(lws_tls_session_dump *)&ts);
      if (iVar1 == 0) {
        ses = d2i_SSL_SESSION((SSL_SESSION **)0x0,(uchar **)(d.tag + 0x58),(long)d.opaque);
        free((void *)d.tag._88_8_);
        if (ses == (SSL_SESSION *)0x0) {
          _lws_log(2,"%s: d2i_SSL_SESSION failed\n","lws_tls_session_dump_load");
        }
        else {
          plVar2 = lws_tls_session_add_entry(vh,(char *)&ts);
          if (plVar2 != (lws_tls_sco_t *)0x0) {
            plVar2->session = (SSL_SESSION *)ses;
            _lws_log(8,"%s: session loaded OK\n","lws_tls_session_dump_load");
            return 0;
          }
          _lws_log(2,"%s: unable to add cache entry\n","lws_tls_session_dump_load");
        }
        SSL_SESSION_free(ses);
      }
      else {
        _lws_log(2,"%s: load failed\n","lws_tls_session_dump_load");
      }
    }
    else {
      _lws_log(4,"%s: session already exists for %s\n","lws_tls_session_dump_load",&ts);
    }
  }
  return 1;
}

Assistant:

int
lws_tls_session_dump_load(struct lws_vhost *vh, const char *host, uint16_t port,
			  lws_tls_sess_cb_t cb_load, void *opq)
{
	struct lws_tls_session_dump d;
	lws_tls_sco_t *ts;
	SSL_SESSION *sess = NULL; /* allow it to "bail" early */
	void *v;

	if (vh->options & LWS_SERVER_OPTION_DISABLE_TLS_SESSION_CACHE)
		return 1;

	d.opaque = opq;
	lws_tls_session_tag_discrete(vh->name, host, port, d.tag, sizeof(d.tag));

	lws_context_lock(vh->context, __func__); /* -------------- cx { */
	lws_vhost_lock(vh); /* -------------- vh { */

	ts = __lws_tls_session_lookup_by_name(vh, d.tag);

	if (ts) {
		/*
		 * Since we are getting this out of cold storage, we should
		 * not replace any existing session since it is likely newer
		 */
		lwsl_notice("%s: session already exists for %s\n", __func__,
				d.tag);
		goto bail1;
	}

	if (cb_load(vh->context, &d)) {
		lwsl_warn("%s: load failed\n", __func__);

		goto bail1;
	}

	/* the callback has allocated the blob and set d.blob / d.blob_len */

	v = d.blob;
	/* this advances d.blob by the blob size ;-) */
	sess = d2i_SSL_SESSION(NULL, (const uint8_t **)&d.blob,
							(long)d.blob_len);
	free(v); /* user code will have used malloc() */
	if (!sess) {
		lwsl_warn("%s: d2i_SSL_SESSION failed\n", __func__);
		goto bail;
	}

	lws_vhost_lock(vh); /* -------------- vh { */
	ts = lws_tls_session_add_entry(vh, d.tag);
	lws_vhost_unlock(vh); /* } vh --------------  */

	if (!ts) {
		lwsl_warn("%s: unable to add cache entry\n", __func__);
		goto bail;
	}

	ts->session = sess;
	lwsl_tlssess("%s: session loaded OK\n", __func__);

	lws_vhost_unlock(vh); /* } vh --------------  */
	lws_context_unlock(vh->context); /* } cx --------------  */

	return 0;

bail:
	SSL_SESSION_free(sess);
bail1:

	lws_vhost_unlock(vh); /* } vh --------------  */
	lws_context_unlock(vh->context); /* } cx --------------  */

	return 1;
}